

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextobject.cpp
# Opt level: O1

QTextLayout * __thiscall QTextBlock::layout(QTextBlock *this)

{
  QTextLayout *pQVar1;
  long *plVar2;
  
  if (this->p != (QTextDocumentPrivate *)0x0) {
    if ((ulong)(uint)this->n == 0) {
      pQVar1 = (QTextLayout *)0x0;
    }
    else {
      plVar2 = (long *)((long)(this->p->blocks).data.field_0.head +
                       (ulong)(uint)this->n * 0x48 + 0x30);
      if (*plVar2 == 0) {
        pQVar1 = (QTextLayout *)operator_new(8);
        QTextLayout::QTextLayout(pQVar1,this);
        *plVar2 = (long)pQVar1;
      }
      pQVar1 = (QTextLayout *)*plVar2;
    }
    return pQVar1;
  }
  return (QTextLayout *)0x0;
}

Assistant:

QTextLayout *QTextBlock::layout() const
{
    if (!p || !n)
        return nullptr;

    const QTextBlockData *b = p->blockMap().fragment(n);
    if (!b->layout)
        b->layout = new QTextLayout(*this);
    return b->layout;
}